

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FillPatchUtil_I.H
# Opt level: O2

enable_if_t<IsFabArray<MultiFab>::value>
amrex::
FillPatchTwoLevels<amrex::MultiFab,amrex::StateDataPhysBCFunct,amrex::Interpolater,amrex::NullInterpHook<amrex::FArrayBox>,amrex::NullInterpHook<amrex::FArrayBox>>
          (Array<amrex::MultiFab_*,_3> *mf,IntVect *nghost,Real time,
          Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
          *cmf,Vector<double,_std::allocator<double>_> *ct,
          Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
          *fmf,Vector<double,_std::allocator<double>_> *ft,int scomp,int dcomp,int ncomp,
          Geometry *cgeom,Geometry *fgeom,Array<amrex::StateDataPhysBCFunct,_3> *cbc,
          Array<int,_3> *cbccomp,Array<amrex::StateDataPhysBCFunct,_3> *fbc,Array<int,_3> *fbccomp,
          IntVect *ratio,Interpolater *mapper,Array<Vector<BCRec>,_3> *bcs,Array<int,_3> *bcscomp,
          NullInterpHook<amrex::FArrayBox> *pre_interp,NullInterpHook<amrex::FArrayBox> *post_interp
          )

{
  DistributionMapping *dm;
  undefined8 *puVar1;
  undefined8 *puVar2;
  element_type *peVar3;
  pointer paVar4;
  pointer ppMVar5;
  MultiFab *pMVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  IndexType IVar10;
  array<amrex::MultiFab_*,_3UL> *fmf_a;
  IndexSpace *index_space;
  FPinfo *ba;
  long lVar11;
  pointer paVar12;
  Periodicity *pPVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  FabArray<amrex::FArrayBox> *pFVar18;
  FabArray<amrex::FArrayBox> *pFVar19;
  FabArray<amrex::IArrayBox> *this;
  array<amrex::MultiFab_*,_3UL> *mfab_1;
  int d;
  long lVar20;
  ulong uVar21;
  array<amrex::MultiFab_*,_3UL> *mfab;
  long lVar22;
  bool bVar23;
  Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
  *__range5_1;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> fmf_time;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> cmf_time;
  Array<iFAB_*,_3> mfab_2;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> bcr_d;
  Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
  *__range5;
  Vector<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_> bcr;
  InterpolaterBoxCoarsener local_1518;
  CPC mask_cpc;
  MultiFab mf_known;
  MultiFab mf_solution;
  Array<amrex::MultiFab,_3> mf_crse_patch;
  Array<amrex::MultiFab,_3> mf_refined_patch;
  MultiFab fmf_cc_dummy;
  MultiFab mf_cc_dummy;
  Array<iMultiFab,_3> solve_mask;
  
  index_space = EB2::TopIndexSpaceIfPresent();
  iVar16 = nghost->vect[1];
  if (nghost->vect[1] < nghost->vect[0]) {
    iVar16 = nghost->vect[0];
  }
  if (iVar16 <= nghost->vect[2]) {
    iVar16 = nghost->vect[2];
  }
  if (iVar16 < 1) {
    pMVar6 = ((fmf->
              super_vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
              ).
              super__Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0];
    if (((mf->_M_elems[0]->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_ref.
         super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
         (pMVar6->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_ref.
         super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr) &&
       ((mf->_M_elems[0]->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap.m_ref
        .super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        *(element_type **)
         &(pMVar6->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap.m_ref))
    goto LAB_0024502d;
  }
  InterpBase::BoxCoarsener(&mapper->super_InterpBase,ratio);
  solve_mask._0_8_ = 0;
  solve_mask._8_4_ = 0;
  convert((BoxArray *)&mf_crse_patch,
          &(mf->_M_elems[0]->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,
          (IntVect *)&solve_mask);
  mf_refined_patch._M_elems[0].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.
  m_op._4_8_ = 0;
  mf_refined_patch._M_elems[0].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.
  m_op._12_8_ = 0;
  mf_refined_patch._M_elems[0].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.
  m_op._20_8_ = 0;
  mf_refined_patch._M_elems[0].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
  _vptr_FabArrayBase = (_func_int **)0x0;
  mf_refined_patch._M_elems[0].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.
  _0_8_ = 0;
  fmf_cc_dummy.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
       (_func_int **)&PTR__FabFactory_006d8928;
  MultiFab::MultiFab(&mf_cc_dummy,(BoxArray *)&mf_crse_patch,
                     &(mf->_M_elems[0]->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                      distributionMap,ncomp,nghost,(MFInfo *)&mf_refined_patch,
                     (FabFactory<amrex::FArrayBox> *)&fmf_cc_dummy);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mf_refined_patch._M_elems[0].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                boxarray.m_bat.m_op.m_bndryReg.m_typ);
  BoxArray::~BoxArray((BoxArray *)&mf_crse_patch);
  solve_mask._0_8_ = 0;
  solve_mask._8_4_ = 0;
  convert((BoxArray *)&mf_crse_patch,
          &(((fmf->
             super_vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
             ).
             super__Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0]->
           super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,(IntVect *)&solve_mask);
  mf_refined_patch._M_elems[0].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.
  m_op._20_8_ = 0;
  mf_refined_patch._M_elems[0].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.
  m_op._4_8_ = 0;
  mf_refined_patch._M_elems[0].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.
  m_op._12_8_ = 0;
  mf_refined_patch._M_elems[0].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
  _vptr_FabArrayBase = (_func_int **)0x0;
  mf_refined_patch._M_elems[0].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.
  _0_8_ = 0;
  mf_known.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
       (_func_int **)&PTR__FabFactory_006d8928;
  MultiFab::MultiFab(&fmf_cc_dummy,(BoxArray *)&mf_crse_patch,
                     &(((fmf->
                        super_vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                        ).
                        super__Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0]->
                      super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap,ncomp,
                     nghost,(MFInfo *)&mf_refined_patch,(FabFactory<amrex::FArrayBox> *)&mf_known);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mf_refined_patch._M_elems[0].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                boxarray.m_bat.m_op.m_bndryReg.m_typ);
  BoxArray::~BoxArray((BoxArray *)&mf_crse_patch);
  ba = FabArrayBase::TheFPinfo
                 ((FabArrayBase *)&fmf_cc_dummy,(FabArrayBase *)&mf_cc_dummy,nghost,
                  &local_1518.super_BoxConverter,fgeom,cgeom,index_space);
  peVar3 = (ba->ba_crse_patch).m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if ((peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      (peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    std::array<amrex::MultiFab,_3UL>::array(&mf_crse_patch);
    std::array<amrex::MultiFab,_3UL>::array(&mf_refined_patch);
    std::array<amrex::iMultiFab,_3UL>::array(&solve_mask);
    dm = &ba->dm_patch;
    lVar20 = 0;
    for (lVar22 = 0; lVar22 != 3; lVar22 = lVar22 + 1) {
      IVar10 = BATransformer::index_type
                         (&(mf->_M_elems[lVar22]->super_FabArray<amrex::FArrayBox>).
                           super_FabArrayBase.boxarray.m_bat);
      convert((BoxArray *)&mf_solution,&ba->ba_crse_patch,IVar10);
      mask_cpc.super_CommMetaData.m_threadsafe_loc = true;
      mask_cpc.super_CommMetaData.m_threadsafe_rcv = false;
      mask_cpc.super_CommMetaData._2_6_ = 0;
      mask_cpc.super_CommMetaData.m_RcvTags._M_t.
      super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
      .
      super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
      ._M_head_impl._0_4_ = 0;
      mask_cpc.super_CommMetaData.m_RcvTags._M_t.
      super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
      .
      super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
      ._M_head_impl._4_4_ = 0;
      mask_cpc.m_srcbdk.m_ba_id.data = (BARef *)0x0;
      mask_cpc.super_CommMetaData.m_LocTags._M_t.
      super___uniq_ptr_impl<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
      .
      super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
      ._M_head_impl._0_4_ = 0;
      mask_cpc.super_CommMetaData.m_LocTags._M_t.
      super___uniq_ptr_impl<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
      .
      super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
      ._M_head_impl._4_4_ = 0;
      mask_cpc.super_CommMetaData.m_SndTags._M_t.
      super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
      .
      super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
      ._M_head_impl._0_4_ = 0;
      mask_cpc.super_CommMetaData.m_SndTags._M_t.
      super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
      .
      super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
      ._M_head_impl._4_4_ = 0;
      MultiFab::MultiFab((MultiFab *)&mf_known.super_FabArray<amrex::FArrayBox>,
                         (BoxArray *)&mf_solution,dm,ncomp,0,(MFInfo *)&mask_cpc,
                         (ba->fact_crse_patch)._M_t.
                         super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                         _M_head_impl);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&mask_cpc.super_CommMetaData.m_SndTags);
      BoxArray::~BoxArray((BoxArray *)&mf_solution);
      pFVar18 = &mf_crse_patch._M_elems[lVar22].super_FabArray<amrex::FArrayBox>;
      FabArray<amrex::FArrayBox>::operator=(pFVar18,&mf_known.super_FabArray<amrex::FArrayBox>);
      MultiFab::~MultiFab((MultiFab *)&mf_known.super_FabArray<amrex::FArrayBox>);
      IVar10 = BATransformer::index_type
                         (&(mf->_M_elems[lVar22]->super_FabArray<amrex::FArrayBox>).
                           super_FabArrayBase.boxarray.m_bat);
      fmf_time.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_start = *(pointer *)ratio->vect;
      fmf_time.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(fmf_time.
                             super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                             super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish._4_4_,ratio->vect[2]);
      coarsen((BoxArray *)&bcr,&ba->ba_fine_patch,(IntVect *)&fmf_time);
      refine((BoxArray *)&mask_cpc,(BoxArray *)&bcr,(IntVect *)&fmf_time);
      convert((BoxArray *)&mf_solution,(BoxArray *)&mask_cpc,IVar10);
      cmf_time.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x1;
      cmf_time.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      cmf_time.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      MultiFab::MultiFab((MultiFab *)&mf_known.super_FabArray<amrex::FArrayBox>,
                         (BoxArray *)&mf_solution,dm,ncomp,0,(MFInfo *)&cmf_time,
                         (ba->fact_fine_patch)._M_t.
                         super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                         _M_head_impl);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cmf_time.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
      BoxArray::~BoxArray((BoxArray *)&mf_solution);
      BoxArray::~BoxArray((BoxArray *)&mask_cpc);
      BoxArray::~BoxArray((BoxArray *)&bcr);
      pFVar19 = &mf_refined_patch._M_elems[lVar22].super_FabArray<amrex::FArrayBox>;
      FabArray<amrex::FArrayBox>::operator=(pFVar19,&mf_known.super_FabArray<amrex::FArrayBox>);
      MultiFab::~MultiFab((MultiFab *)&mf_known.super_FabArray<amrex::FArrayBox>);
      IVar10 = BATransformer::index_type
                         (&(mf->_M_elems[lVar22]->super_FabArray<amrex::FArrayBox>).
                           super_FabArrayBase.boxarray.m_bat);
      cmf_time.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_start = *(pointer *)ratio->vect;
      cmf_time.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(cmf_time.
                             super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                             super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish._4_4_,ratio->vect[2]);
      coarsen((BoxArray *)&mask_cpc,&ba->ba_fine_patch,(IntVect *)&cmf_time);
      convert((BoxArray *)&mf_solution,(BoxArray *)&mask_cpc,IVar10);
      bcr.
      super_vector<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_>.
      super__Vector_base<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
      bcr.
      super_vector<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_>.
      super__Vector_base<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      bcr.
      super_vector<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_>.
      super__Vector_base<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      fmf_time.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&PTR__FabFactory_006d9518;
      iMultiFab::iMultiFab
                ((iMultiFab *)&mf_known,(BoxArray *)&mf_solution,dm,ncomp,0,(MFInfo *)&bcr,
                 (FabFactory<amrex::IArrayBox> *)&fmf_time);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&bcr.
                    super_vector<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_>
                    .
                    super__Vector_base<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      BoxArray::~BoxArray((BoxArray *)&mf_solution);
      BoxArray::~BoxArray((BoxArray *)&mask_cpc);
      this = (FabArray<amrex::IArrayBox> *)(&solve_mask.field_0x0 + lVar22 * 0x180);
      FabArray<amrex::IArrayBox>::operator=(this,(FabArray<amrex::IArrayBox> *)&mf_known);
      iMultiFab::~iMultiFab((iMultiFab *)&mf_known);
      anon_unknown_148::mf_set_domain_bndry<amrex::MultiFab,_0>((MultiFab *)pFVar18,cgeom);
      cmf_time.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmf_time.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      cmf_time.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      paVar4 = (cmf->
               super_vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
               ).
               super__Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (paVar12 = (cmf->
                     super_vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                     ).
                     super__Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; paVar12 != paVar4;
          paVar12 = paVar12 + 1) {
        std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::push_back
                  (&cmf_time.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>,
                   (value_type *)((long)paVar12->_M_elems + lVar20));
      }
      FillPatchSingleLevel<amrex::MultiFab,amrex::StateDataPhysBCFunct>
                ((MultiFab *)pFVar18,time,
                 (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                 &cmf_time.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>,ct,
                 scomp,0,ncomp,cgeom,(StateDataPhysBCFunct *)(&cbc->field_0x0 + lVar22 * 0x18),
                 cbccomp->_M_elems[lVar22]);
      anon_unknown_148::mf_set_domain_bndry<amrex::MultiFab,_0>((MultiFab *)pFVar19,fgeom);
      fmf_time.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      fmf_time.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      fmf_time.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      paVar4 = (fmf->
               super_vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
               ).
               super__Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (paVar12 = (fmf->
                     super_vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                     ).
                     super__Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; paVar12 != paVar4;
          paVar12 = paVar12 + 1) {
        std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::push_back
                  (&fmf_time.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>,
                   (value_type *)((long)paVar12->_M_elems + lVar20));
      }
      FillPatchSingleLevel<amrex::MultiFab,amrex::StateDataPhysBCFunct>
                ((MultiFab *)pFVar19,time,
                 (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                 &fmf_time.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>,ft,
                 scomp,0,ncomp,fgeom,(StateDataPhysBCFunct *)(&fbc->field_0x0 + lVar22 * 0x18),
                 fbccomp->_M_elems[lVar22]);
      coarsen((BoxArray *)&mf_solution,
              &(((fmf->
                 super_vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                 ).
                 super__Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_elems[lVar22]->
               super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,ratio);
      mask_cpc.super_CommMetaData.m_SndTags._M_t.
      super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
      .
      super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
      ._M_head_impl._0_4_ = 0;
      mask_cpc.super_CommMetaData.m_SndTags._M_t.
      super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
      .
      super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
      ._M_head_impl._4_4_ = 0;
      mask_cpc.super_CommMetaData.m_RcvTags._M_t.
      super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
      .
      super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
      ._M_head_impl._0_4_ = 0;
      mask_cpc.super_CommMetaData.m_RcvTags._M_t.
      super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
      .
      super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
      ._M_head_impl._4_4_ = 0;
      mask_cpc.super_CommMetaData.m_threadsafe_loc = false;
      mask_cpc.super_CommMetaData.m_threadsafe_rcv = false;
      mask_cpc.super_CommMetaData._2_6_ = 0;
      mask_cpc.super_CommMetaData.m_LocTags._M_t.
      super___uniq_ptr_impl<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
      .
      super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
      ._M_head_impl._0_4_ = 0;
      mask_cpc.super_CommMetaData.m_LocTags._M_t.
      super___uniq_ptr_impl<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
      .
      super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
      ._M_head_impl._4_4_ = 0;
      mask_cpc.m_srcbdk.m_ba_id.data = (BARef *)0x0;
      bcr.
      super_vector<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_>.
      super__Vector_base<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__FabFactory_006d8928;
      MultiFab::MultiFab(&mf_known,(BoxArray *)&mf_solution,
                         &(((fmf->
                            super_vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                            ).
                            super__Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_elems[lVar22]->
                          super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap,ncomp
                         ,nghost,(MFInfo *)&mask_cpc,(FabFactory<amrex::FArrayBox> *)&bcr);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&mask_cpc.super_CommMetaData.m_SndTags);
      BoxArray::~BoxArray((BoxArray *)&mf_solution);
      coarsen((BoxArray *)&mask_cpc,
              &mf_refined_patch._M_elems[lVar22].super_FabArray<amrex::FArrayBox>.super_FabArrayBase
               .boxarray,ratio);
      bcr.
      super_vector<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_>.
      super__Vector_base<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bcr.
      super_vector<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_>.
      super__Vector_base<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      bcr.
      super_vector<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_>.
      super__Vector_base<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      mfab_2._M_elems[0] = (IArrayBox *)&PTR__FabFactory_006d8928;
      MultiFab::MultiFab(&mf_solution,(BoxArray *)&mask_cpc,
                         &mf_refined_patch._M_elems[lVar22].super_FabArray<amrex::FArrayBox>.
                          super_FabArrayBase.distributionMap,ncomp,0,(MFInfo *)&bcr,
                         (FabFactory<amrex::FArrayBox> *)&mfab_2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&bcr.
                    super_vector<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_>
                    .
                    super__Vector_base<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      BoxArray::~BoxArray((BoxArray *)&mask_cpc);
      bcr.
      super_vector<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_>.
      super__Vector_base<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      bcr.
      super_vector<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_>.
      super__Vector_base<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)((ulong)bcr.
                            super_vector<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_>
                            .
                            super__Vector_base<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
      mfab_2._M_elems[0] = (IArrayBox *)0x0;
      mfab_2._M_elems[1] = (IArrayBox *)((ulong)mfab_2._M_elems[1] & 0xffffffff00000000);
      bcr_d.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
      super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
      super__Vector_impl_data._0_12_ = Geometry::periodicity(fgeom);
      FabArrayBase::CPC::CPC
                (&mask_cpc,(FabArrayBase *)&mf_solution,(IntVect *)&bcr,(FabArrayBase *)&mf_known,
                 (IntVect *)&mfab_2,(Periodicity *)&bcr_d,false);
      FabArray<amrex::IArrayBox>::setVal<amrex::IArrayBox,_0>(this,1);
      FabArray<amrex::IArrayBox>::setVal<amrex::IArrayBox,_0>
                (this,0,&mask_cpc.super_CommMetaData,0,1);
      FabArrayBase::CPC::~CPC(&mask_cpc);
      MultiFab::~MultiFab(&mf_solution);
      MultiFab::~MultiFab(&mf_known);
      std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
                ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&fmf_time);
      std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
                ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&cmf_time);
      lVar20 = lVar20 + 8;
    }
    std::vector<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_>::
    vector(&bcr.
            super_vector<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_>
           ,(long)ncomp,(allocator_type *)&mf_known);
    uVar21 = 0;
    MFIter::MFIter((MFIter *)&mf_known,(FabArrayBase *)&mf_refined_patch,'\0');
    if (0 < ncomp) {
      uVar21 = (ulong)(uint)ncomp;
    }
    while (lVar20 = (long)mf_known.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.
                          m_bat.m_op.m_bndryReg.m_loshft.vect[0],
          mf_known.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
          m_bndryReg.m_loshft.vect[0] <
          mf_known.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
          m_bndryReg.m_loshft.vect[2]) {
      if (mf_known.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._52_8_ ==
          0) {
        cmf_time.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)mf_crse_patch._M_elems[0].super_FabArray<amrex::FArrayBox>.m_fabs_v.
                      super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar20];
        cmf_time.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)mf_crse_patch._M_elems[1].super_FabArray<amrex::FArrayBox>.m_fabs_v.
                      super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar20];
        cmf_time.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)mf_crse_patch._M_elems[2].super_FabArray<amrex::FArrayBox>.m_fabs_v.
                      super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar20];
        fmf_time.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)mf_refined_patch._M_elems[0].super_FabArray<amrex::FArrayBox>.m_fabs_v.
                      super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar20];
        fmf_time.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)mf_refined_patch._M_elems[1].super_FabArray<amrex::FArrayBox>.m_fabs_v.
                      super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar20];
        fmf_time.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)mf_refined_patch._M_elems[2].super_FabArray<amrex::FArrayBox>.m_fabs_v.
                      super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar20];
        mfab_2._M_elems[0] = *(IArrayBox **)(solve_mask._264_8_ + lVar20 * 8);
        mfab_2._M_elems[1] = *(IArrayBox **)(solve_mask._648_8_ + lVar20 * 8);
      }
      else {
        cmf_time.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)mf_crse_patch._M_elems[0].super_FabArray<amrex::FArrayBox>.m_fabs_v.
                      super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                      _M_impl.super__Vector_impl_data._M_start
                      [*(int *)(*(long *)mf_known.super_FabArray<amrex::FArrayBox>.
                                         super_FabArrayBase.boxarray.m_bat.m_op._52_8_ + lVar20 * 4)
                      ];
        cmf_time.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)mf_crse_patch._M_elems[1].super_FabArray<amrex::FArrayBox>.m_fabs_v.
                      super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                      _M_impl.super__Vector_impl_data._M_start
                      [*(int *)(*(long *)mf_known.super_FabArray<amrex::FArrayBox>.
                                         super_FabArrayBase.boxarray.m_bat.m_op._52_8_ + lVar20 * 4)
                      ];
        cmf_time.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)mf_crse_patch._M_elems[2].super_FabArray<amrex::FArrayBox>.m_fabs_v.
                      super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                      _M_impl.super__Vector_impl_data._M_start
                      [*(int *)(*(long *)mf_known.super_FabArray<amrex::FArrayBox>.
                                         super_FabArrayBase.boxarray.m_bat.m_op._52_8_ + lVar20 * 4)
                      ];
        fmf_time.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)mf_refined_patch._M_elems[0].super_FabArray<amrex::FArrayBox>.m_fabs_v.
                      super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                      _M_impl.super__Vector_impl_data._M_start
                      [*(int *)(*(long *)mf_known.super_FabArray<amrex::FArrayBox>.
                                         super_FabArrayBase.boxarray.m_bat.m_op._52_8_ + lVar20 * 4)
                      ];
        fmf_time.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)mf_refined_patch._M_elems[1].super_FabArray<amrex::FArrayBox>.m_fabs_v.
                      super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                      _M_impl.super__Vector_impl_data._M_start
                      [*(int *)(*(long *)mf_known.super_FabArray<amrex::FArrayBox>.
                                         super_FabArrayBase.boxarray.m_bat.m_op._52_8_ + lVar20 * 4)
                      ];
        fmf_time.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)mf_refined_patch._M_elems[2].super_FabArray<amrex::FArrayBox>.m_fabs_v.
                      super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                      _M_impl.super__Vector_impl_data._M_start
                      [*(int *)(*(long *)mf_known.super_FabArray<amrex::FArrayBox>.
                                         super_FabArrayBase.boxarray.m_bat.m_op._52_8_ + lVar20 * 4)
                      ];
        mfab_2._M_elems[0] =
             *(IArrayBox **)
              (solve_mask._264_8_ +
              (long)*(int *)(*(long *)mf_known.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                                      boxarray.m_bat.m_op._52_8_ + lVar20 * 4) * 8);
        mfab_2._M_elems[1] =
             *(IArrayBox **)
              (solve_mask._648_8_ +
              (long)*(int *)(*(long *)mf_known.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                                      boxarray.m_bat.m_op._52_8_ + lVar20 * 4) * 8);
        lVar20 = (long)*(int *)(*(long *)mf_known.super_FabArray<amrex::FArrayBox>.
                                         super_FabArrayBase.boxarray.m_bat.m_op._52_8_ + lVar20 * 4)
        ;
      }
      mfab_2._M_elems[2] = *(IArrayBox **)(solve_mask._1032_8_ + lVar20 * 8);
      mf_solution.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase._0_4_ =
           (((FArrayBox *)
            fmf_time.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
            super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
            super__Vector_impl_data._M_start)->super_BaseFab<double>).domain.smallend.vect[0];
      mf_solution.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase._4_4_ =
           (((FArrayBox *)
            fmf_time.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
            super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
            super__Vector_impl_data._M_start)->super_BaseFab<double>).domain.smallend.vect[1];
      mf_solution.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_bat_type =
           (((FArrayBox *)
            fmf_time.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
            super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
            super__Vector_impl_data._M_start)->super_BaseFab<double>).domain.smallend.vect[2];
      uVar7 = *(undefined8 *)
               ((((FArrayBox *)
                 fmf_time.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                 super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                 super__Vector_impl_data._M_start)->super_BaseFab<double>).domain.bigend.vect + 2);
      mf_solution.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg
      .m_typ.itype = SUB84((ulong)*(undefined8 *)
                                   (((FArrayBox *)
                                    fmf_time.
                                    super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                    .
                                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                   super_BaseFab<double>).domain.bigend.vect >> 0x20,0);
      mf_solution.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg
      .m_crse_ratio.vect[1] = (int)((ulong)uVar7 >> 0x20);
      iVar16 = mf_solution.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
               m_bndryReg.m_crse_ratio.vect[1] << 0x1d;
      mf_solution.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg
      .m_typ.itype = (IndexType)
                     (IndexType)
                     ((int)mf_solution.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.
                           m_bat.m_op.m_bndryReg.m_typ.itype +
                     ((mf_solution.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.
                       m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1] << 0x1e) >> 0x1f));
      mf_solution.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
      m_indexType.m_typ.itype =
           (BATindexType)
           (BATindexType)
           ((((FArrayBox *)
             fmf_time.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
             super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
             super__Vector_impl_data._M_start)->super_BaseFab<double>).domain.bigend.vect[0] -
           (mf_solution.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
            m_bndryReg.m_crse_ratio.vect[1] & 1U));
      mf_solution.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg
      .m_crse_ratio.vect[0] = (int)uVar7;
      mf_solution.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg
      .m_crse_ratio.vect[1] = 0;
      mf_solution.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg
      .m_crse_ratio.vect[0] =
           mf_solution.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
           m_bndryReg.m_crse_ratio.vect[0] + (iVar16 >> 0x1f);
      lVar22 = 0;
      for (lVar20 = 0; lVar20 != 3; lVar20 = lVar20 + 1) {
        std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
                  (&bcr_d.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,(long)ncomp,
                   (allocator_type *)&mask_cpc);
        ppMVar5 = (&cmf_time.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start)[lVar20];
        IVar10 = BATransformer::index_type
                           (&(mf->_M_elems[lVar20]->super_FabArray<amrex::FArrayBox>).
                             super_FabArrayBase.boxarray.m_bat);
        mask_cpc.super_CommMetaData._0_8_ = *(undefined8 *)(cgeom->domain).smallend.vect;
        uVar7 = *(undefined8 *)(cgeom->domain).bigend.vect;
        uVar8 = *(undefined8 *)((cgeom->domain).bigend.vect + 2);
        mask_cpc.super_CommMetaData.m_LocTags._M_t.
        super___uniq_ptr_impl<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
        .
        super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
        ._M_head_impl._0_4_ = (undefined4)*(undefined8 *)((cgeom->domain).smallend.vect + 2);
        mask_cpc.super_CommMetaData.m_LocTags._M_t.
        super___uniq_ptr_impl<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
        .
        super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
        ._M_head_impl._4_4_ = (undefined4)uVar7;
        mask_cpc.super_CommMetaData.m_SndTags._M_t.
        super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
        .
        super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
        ._M_head_impl._0_4_ = (undefined4)((ulong)uVar7 >> 0x20);
        mask_cpc.super_CommMetaData.m_SndTags._M_t.
        super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
        .
        super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
        ._M_head_impl._4_4_ = (undefined4)uVar8;
        mask_cpc.super_CommMetaData.m_RcvTags._M_t.
        super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
        .
        super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
        ._M_head_impl._0_4_ = (uint)((ulong)uVar8 >> 0x20);
        for (lVar15 = 0; uVar14 = (uint)lVar15, lVar15 != 3; lVar15 = lVar15 + 1) {
          uVar17 = 1 << ((byte)lVar15 & 0x1f);
          mask_cpc.m_srcng.vect[lVar15 + -0xd] =
               (mask_cpc.m_srcng.vect[lVar15 + -0xd] +
               (uint)((IVar10.itype >> (uVar14 & 0x1f) & 1) != 0)) -
               (uint)(((uint)mask_cpc.super_CommMetaData.m_RcvTags._M_t.
                             super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                             .
                             super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
                             ._M_head_impl >> (uVar14 & 0x1f) & 1) != 0);
          if ((IVar10.itype >> (uVar14 & 0x1f) & 1) == 0) {
            mask_cpc.super_CommMetaData.m_RcvTags._M_t.
            super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
            .
            super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
            ._M_head_impl._0_4_ =
                 ~uVar17 & (uint)mask_cpc.super_CommMetaData.m_RcvTags._M_t.
                                 super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
                                 ._M_head_impl;
          }
          else {
            mask_cpc.super_CommMetaData.m_RcvTags._M_t.
            super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
            .
            super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
            ._M_head_impl._0_4_ =
                 uVar17 | (uint)mask_cpc.super_CommMetaData.m_RcvTags._M_t.
                                super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                                .
                                super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
                                ._M_head_impl;
          }
        }
        setBC((Box *)(ppMVar5 + 3),(Box *)&mask_cpc,bcscomp->_M_elems[lVar20],0,ncomp,
              bcs->_M_elems + lVar20,&bcr_d);
        lVar15 = lVar22;
        for (lVar11 = 0; uVar21 * 0x18 - lVar11 != 0; lVar11 = lVar11 + 0x18) {
          *(undefined8 *)
           ((long)(bcr.
                   super_vector<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_>
                   .
                   super__Vector_base<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].bc + lVar15 + 0x10) =
               *(undefined8 *)
                ((long)(bcr_d.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                        super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                        super__Vector_impl_data._M_start)->bc + lVar11 + 0x10);
          puVar1 = (undefined8 *)
                   ((long)(bcr_d.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                           super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                           super__Vector_impl_data._M_start)->bc + lVar11);
          uVar7 = puVar1[1];
          puVar2 = (undefined8 *)
                   ((long)(bcr.
                           super_vector<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_>
                           .
                           super__Vector_base<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].bc + lVar15);
          *puVar2 = *puVar1;
          puVar2[1] = uVar7;
          lVar15 = lVar15 + 0x48;
        }
        std::_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~_Vector_base
                  ((_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)&bcr_d);
        lVar22 = lVar22 + 0x18;
      }
      (*(mapper->super_InterpBase)._vptr_InterpBase[6])
                (mapper,&cmf_time,0,&fmf_time,0,(ulong)(uint)ncomp,&mf_solution,ratio,&mfab_2,cgeom,
                 fgeom,&bcr,0,0,0);
      MFIter::operator++((MFIter *)&mf_known);
    }
    MFIter::~MFIter((MFIter *)&mf_known);
    std::
    _Vector_base<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_>::
    ~_Vector_base((_Vector_base<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_>
                   *)&bcr);
    lVar20 = 0;
    for (lVar22 = 0; lVar22 != 3; lVar22 = lVar22 + 1) {
      bVar23 = false;
      for (paVar12 = (fmf->
                     super_vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                     ).
                     super__Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          paVar12 !=
          (fmf->
          super_vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
          ).
          super__Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; paVar12 = paVar12 + 1) {
        bVar9 = !bVar23;
        bVar23 = true;
        if (bVar9) {
          bVar23 = mf->_M_elems[lVar22] == *(MultiFab **)((long)paVar12->_M_elems + lVar20);
        }
      }
      pFVar18 = &mf->_M_elems[lVar22]->super_FabArray<amrex::FArrayBox>;
      pFVar19 = &mf_refined_patch._M_elems[lVar22].super_FabArray<amrex::FArrayBox>;
      if (bVar23) {
        mf_known.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
             (_func_int **)0x0;
        mf_known.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_bat_type =
             null;
        pPVar13 = Periodicity::NonPeriodic();
        FabArray<amrex::FArrayBox>::ParallelCopyToGhost
                  (pFVar18,pFVar19,0,dcomp,ncomp,(IntVect *)&mf_known,nghost,pPVar13);
      }
      else {
        mf_known.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
             (_func_int **)0x0;
        mf_known.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_bat_type =
             null;
        pPVar13 = Periodicity::NonPeriodic();
        FabArray<amrex::FArrayBox>::ParallelCopy
                  (pFVar18,pFVar19,0,dcomp,ncomp,(IntVect *)&mf_known,nghost,pPVar13,COPY,(CPC *)0x0
                  );
      }
      lVar20 = lVar20 + 8;
    }
    std::array<amrex::iMultiFab,_3UL>::~array(&solve_mask);
    std::array<amrex::MultiFab,_3UL>::~array(&mf_refined_patch);
    std::array<amrex::MultiFab,_3UL>::~array(&mf_crse_patch);
  }
  MultiFab::~MultiFab(&fmf_cc_dummy);
  MultiFab::~MultiFab(&mf_cc_dummy);
  InterpolaterBoxCoarsener::~InterpolaterBoxCoarsener(&local_1518);
LAB_0024502d:
  lVar20 = 0;
  for (lVar22 = 0; lVar22 != 3; lVar22 = lVar22 + 1) {
    mf_crse_patch._M_elems[0].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.
    m_op._4_8_ = 0;
    mf_crse_patch._M_elems[0].super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase
         = (_func_int **)0x0;
    mf_crse_patch._M_elems[0].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.
    _0_8_ = 0;
    paVar4 = (fmf->
             super_vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
             ).
             super__Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (paVar12 = (fmf->
                   super_vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                   ).
                   super__Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; paVar12 != paVar4;
        paVar12 = paVar12 + 1) {
      std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::push_back
                ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&mf_crse_patch,
                 (value_type *)((long)paVar12->_M_elems + lVar20));
    }
    FillPatchSingleLevel<amrex::MultiFab,amrex::StateDataPhysBCFunct>
              (mf->_M_elems[lVar22],nghost,time,
               (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&mf_crse_patch,ft,
               scomp,dcomp,ncomp,fgeom,(StateDataPhysBCFunct *)(&fbc->field_0x0 + lVar22 * 0x18),
               fbccomp->_M_elems[lVar22]);
    std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
              ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&mf_crse_patch
              );
    lVar20 = lVar20 + 8;
  }
  return;
}

Assistant:

std::enable_if_t<IsFabArray<MF>::value>
FillPatchTwoLevels (Array<MF*, AMREX_SPACEDIM> const& mf, IntVect const& nghost, Real time,
                    const Vector<Array<MF*, AMREX_SPACEDIM> >& cmf, const Vector<Real>& ct,
                    const Vector<Array<MF*, AMREX_SPACEDIM> >& fmf, const Vector<Real>& ft,
                    int scomp, int dcomp, int ncomp,
                    const Geometry& cgeom, const Geometry& fgeom,
                    Array<BC, AMREX_SPACEDIM>& cbc, const Array<int, AMREX_SPACEDIM>& cbccomp,
                    Array<BC, AMREX_SPACEDIM>& fbc, const Array<int, AMREX_SPACEDIM>& fbccomp,
                    const IntVect& ratio,
                    Interp* mapper,
                    const Array<Vector<BCRec>, AMREX_SPACEDIM>& bcs, const Array<int, AMREX_SPACEDIM>& bcscomp,
                    const PreInterpHook& pre_interp,
                    const PostInterpHook& post_interp)
{
#ifdef AMREX_USE_EB
    EB2::IndexSpace const* index_space = EB2::TopIndexSpaceIfPresent();
#else
    EB2::IndexSpace const* index_space = nullptr;
#endif

    FillPatchTwoLevels_doit(mf,nghost,time,cmf,ct,fmf,ft,
                            scomp,dcomp,ncomp,cgeom,fgeom,
                            cbc,cbccomp,fbc,fbccomp,ratio,mapper,bcs,bcscomp,
                            pre_interp,post_interp,index_space);
}